

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

int rlbot::Interface::SendQuickChat(QuickChatSelection message,int botIndex,bool teamOnly)

{
  code *pcVar1;
  Offset<rlbot::flat::QuickChat> root;
  int iVar2;
  uint8_t *puVar3;
  FlatBufferBuilder builder;
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder(&builder,0x32,(Allocator *)0x0,false,8);
  root = flat::CreateQuickChat(&builder,message,botIndex,teamOnly,0,0.0);
  flatbuffers::FlatBufferBuilder::Finish<rlbot::flat::QuickChat>(&builder,root,(char *)0x0);
  pcVar1 = _sendQuickChat;
  puVar3 = flatbuffers::FlatBufferBuilder::GetBufferPointer(&builder);
  iVar2 = (*pcVar1)(puVar3,((int)builder.buf_.reserved_ - (int)builder.buf_.cur_) +
                           (int)builder.buf_.buf_);
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder(&builder);
  return iVar2;
}

Assistant:

int Interface::SendQuickChat(rlbot::flat::QuickChatSelection message,
                             int botIndex, bool teamOnly) {
  flatbuffers::FlatBufferBuilder builder(50);

  auto quickChatOffset =
      rlbot::flat::CreateQuickChat(builder, message, botIndex, teamOnly);
  builder.Finish(quickChatOffset);

  return _sendQuickChat(builder.GetBufferPointer(), builder.GetSize());
}